

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O3

iterator __thiscall
glslang::TDefaultIoResolverBase::findSlot(TDefaultIoResolverBase *this,int set,int slot)

{
  int *piVar1;
  int *piVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  ulong uVar5;
  key_type local_24;
  
  pmVar3 = std::__detail::
           _Map_base<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->slots,&local_24);
  piVar1 = (pmVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pmVar3 = std::__detail::
           _Map_base<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->slots,&local_24);
  uVar5 = (long)(pmVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1 >> 2;
  while (piVar2 = piVar1, 0 < (long)uVar5) {
    uVar4 = uVar5 >> 1;
    uVar5 = ~uVar4 + uVar5;
    piVar1 = piVar2 + uVar4 + 1;
    if (slot <= piVar2[uVar4]) {
      piVar1 = piVar2;
      uVar5 = uVar4;
    }
  }
  return (iterator)piVar2;
}

Assistant:

TDefaultIoResolverBase::TSlotSet::iterator TDefaultIoResolverBase::findSlot(int set, int slot) {
    return std::lower_bound(slots[set].begin(), slots[set].end(), slot);
}